

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

Tagger * __thiscall MeCab::anon_unknown_0::ModelImpl::createTagger(ModelImpl *this)

{
  double dVar1;
  TaggerImpl *this_00;
  
  if ((this->viterbi_ == (Viterbi *)0x0) || ((this->writer_).ptr_ == (Writer *)0x0)) {
    setGlobalError("Model is not available");
    this_00 = (TaggerImpl *)0x0;
  }
  else {
    this_00 = (TaggerImpl *)operator_new(0x60);
    (this_00->super_Tagger)._vptr_Tagger = (_func_int **)&PTR_parse_0019d7a0;
    (this_00->model_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019da88;
    (this_00->model_).ptr_ = (ModelImpl *)0x0;
    (this_00->lattice_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0019dac8;
    (this_00->lattice_).ptr_ = (Lattice *)0x0;
    this_00->request_type_ = 1;
    this_00->theta_ = 0.75;
    (this_00->what_)._M_dataplus._M_p = (pointer)&(this_00->what_).field_2;
    (this_00->what_)._M_string_length = 0;
    (this_00->what_).field_2._M_local_buf[0] = '\0';
    this_00->current_model_ = this;
    this_00->request_type_ = this->request_type_;
    dVar1 = this->theta_;
    this_00->theta_ = dVar1;
    TaggerImpl::set_theta(this_00,(float)dVar1);
    (*(this_00->super_Tagger)._vptr_Tagger[0x10])(this_00,(ulong)(uint)this->request_type_);
  }
  return &this_00->super_Tagger;
}

Assistant:

bool is_available() const {
    return (viterbi_ && writer_.get());
  }